

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_utility.h
# Opt level: O0

vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *
testinator::Arbitrary<std::tuple<int>_>::shrink
          (vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *__return_storage_ptr__,
          tuple<int> *t)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<int>_> *p_Var2;
  tuple<> *ptVar3;
  value_type local_b4;
  reference local_b0;
  tuple<> *e_1;
  iterator __end0_1;
  iterator __begin0_1;
  vector<std::tuple<>,_std::allocator<std::tuple<>_>_> *__range2_1;
  undefined1 local_88 [8];
  vector<std::tuple<>,_std::allocator<std::tuple<>_>_> tail_v;
  int *e;
  iterator __end0;
  iterator __begin0;
  vector<int,_std::allocator<int>_> *__range2;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> head_v;
  tuple<int> *t_local;
  vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *ret;
  
  head_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  (__return_storage_ptr__->super__Vector_base<std::tuple<int>,_std::allocator<std::tuple<int>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<std::tuple<int>,_std::allocator<std::tuple<int>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<std::tuple<int>,_std::allocator<std::tuple<int>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>::vector(__return_storage_ptr__);
  p_Var2 = ::std::get<0ul,int>(t);
  detail::Arbitrary_Arithmetic<int>::shrink((vector<int,_std::allocator<int>_> *)local_38,p_Var2);
  __end0 = ::std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)local_38);
  e = (int *)::std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &e);
    if (!bVar1) break;
    ptVar3 = (tuple<> *)
             __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end0);
    tuple_tail<std::tuple<int>const&>
              (t,(enable_if_t<is_tuple<std::decay_t<const_tuple<int>_&>_>::value> *)0x0);
    tuple_cons<int,std::tuple<>>
              ((int *)((long)&tail_v.
                              super__Vector_base<std::tuple<>,_std::allocator<std::tuple<>_>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 4),ptVar3,
               (enable_if_t<is_tuple<std::decay_t<tuple<>_>_>::value> *)
               ((long)&tail_v.super__Vector_base<std::tuple<>,_std::allocator<std::tuple<>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    ::std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>::push_back
              (__return_storage_ptr__,
               (value_type *)
               ((long)&tail_v.super__Vector_base<std::tuple<>,_std::allocator<std::tuple<>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end0);
  }
  tuple_tail<std::tuple<int>const&>
            (t,(enable_if_t<is_tuple<std::decay_t<const_tuple<int>_&>_>::value> *)0x0);
  Arbitrary<std::tuple<>_>::shrink
            ((vector<std::tuple<>,_std::allocator<std::tuple<>_>_> *)local_88,
             (tuple<> *)((long)&__range2_1 + 7));
  __end0_1 = ::std::vector<std::tuple<>,_std::allocator<std::tuple<>_>_>::begin
                       ((vector<std::tuple<>,_std::allocator<std::tuple<>_>_> *)local_88);
  e_1 = (tuple<> *)
        ::std::vector<std::tuple<>,_std::allocator<std::tuple<>_>_>::end
                  ((vector<std::tuple<>,_std::allocator<std::tuple<>_>_> *)local_88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0_1,
                       (__normal_iterator<std::tuple<>_*,_std::vector<std::tuple<>,_std::allocator<std::tuple<>_>_>_>
                        *)&e_1);
    if (!bVar1) break;
    local_b0 = __gnu_cxx::
               __normal_iterator<std::tuple<>_*,_std::vector<std::tuple<>,_std::allocator<std::tuple<>_>_>_>
               ::operator*(&__end0_1);
    ptVar3 = (tuple<> *)::std::get<0ul,int>(t);
    tuple_cons<int_const&,std::tuple<>>((int *)&local_b4,ptVar3,local_b0);
    ::std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>::push_back
              (__return_storage_ptr__,&local_b4);
    __gnu_cxx::
    __normal_iterator<std::tuple<>_*,_std::vector<std::tuple<>,_std::allocator<std::tuple<>_>_>_>::
    operator++(&__end0_1);
  }
  head_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  ::std::vector<std::tuple<>,_std::allocator<std::tuple<>_>_>::~vector
            ((vector<std::tuple<>,_std::allocator<std::tuple<>_>_> *)local_88);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  if ((head_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._7_1_ & 1) == 0) {
    ::std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>::~vector
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::tuple<Ts...>> shrink(const std::tuple<Ts...>& t)
    {
      std::vector<std::tuple<Ts...>> ret{};

      // shrink the head
      using H = std::decay_t<decltype(std::get<0>(t))>;
      auto head_v = Arbitrary<H>::shrink(std::get<0>(t));
      for (auto& e : head_v)
      {
        ret.push_back(tuple_cons(std::move(e), tuple_tail(t)));
      }

      // shrink the tail recursively
      using T = std::decay_t<decltype(tuple_tail(t))>;
      auto tail_v = Arbitrary<T>::shrink(tuple_tail(t));
      for (auto& e : tail_v)
      {
        ret.push_back(tuple_cons(std::get<0>(t), std::move(e)));
      }

      return ret;
    }